

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  urlpieces *part;
  byte bVar1;
  curl_proxytype cVar2;
  Curl_easy *pCVar3;
  char *pcVar4;
  void *pvVar5;
  bool bVar6;
  _Bool _Var7;
  char cVar8;
  unsigned_short uVar9;
  CURLUcode CVar10;
  int iVar11;
  CURLcode CVar12;
  CURLcode CVar13;
  uchar *ch;
  size_t sVar14;
  size_t sVar15;
  connectdata *conn;
  ssl_backend_data *psVar16;
  char *pcVar17;
  CURLU *pCVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  connectbundle *bundle;
  connectdata *pcVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  undefined1 *puVar28;
  ulong uVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  uint uVar33;
  Curl_handler **ppCVar34;
  Curl_handler *pCVar35;
  size_t sVar36;
  char **ppcVar37;
  curltime cVar38;
  _Bool waitpipe;
  _Bool force_reuse;
  connectdata *conn_temp;
  char *zoneid;
  char *local_2a0;
  _Bool local_292;
  _Bool local_291;
  char *local_290;
  Curl_easy *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  size_t local_268;
  size_t local_260;
  _Bool *local_258;
  _Bool *local_250;
  connectdata *local_248;
  char *local_240;
  char *local_238 [31];
  undefined1 local_139;
  char *local_138 [31];
  undefined1 local_39;
  
  conn = (connectdata *)0x0;
  *asyncp = false;
  (*Curl_cfree)((data->req).protop);
  (data->req).protop = (void *)0x0;
  (*Curl_cfree)((data->req).newurl);
  memset(&data->req,0,0x578);
  (data->req).maxdownload = -1;
  local_248 = (connectdata *)0x0;
  local_291 = false;
  local_292 = false;
  sVar14 = Curl_multi_max_host_connections(data->multi);
  sVar15 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  CVar12 = CURLE_URL_MALFORMAT;
  if ((data->change).url != (char *)0x0) {
    local_268 = sVar14;
    conn = (connectdata *)(*Curl_ccalloc)(1,0x630);
    CVar12 = CURLE_OUT_OF_MEMORY;
    if (conn != (connectdata *)0x0) {
      sVar14 = Curl_ssl->sizeof_ssl_backend_data;
      local_260 = sVar15;
      psVar16 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar14);
      if (psVar16 == (ssl_backend_data *)0x0) {
        (*Curl_cfree)(conn);
LAB_004bf955:
        conn = (connectdata *)0x0;
      }
      else {
        conn->ssl_extra = psVar16;
        conn->ssl[0].backend = psVar16;
        conn->ssl[1].backend =
             (ssl_backend_data *)((psVar16->tap_state).master_key + (sVar14 - 0x1c));
        conn->proxy_ssl[0].backend =
             (ssl_backend_data *)((psVar16->tap_state).master_key + sVar14 * 2 + -0x1c);
        conn->proxy_ssl[1].backend =
             (ssl_backend_data *)((psVar16->tap_state).master_key + sVar14 * 3 + -0x1c);
        conn->handler = &Curl_handler_dummy;
        conn->connection_id = -1;
        conn->port = -1;
        conn->remote_port = -1;
        conn->sock[0] = -1;
        conn->sock[1] = -1;
        conn->tempsock[0] = -1;
        conn->tempsock[1] = -1;
        Curl_conncontrol(conn,1);
        cVar38 = Curl_now();
        (conn->created).tv_sec = cVar38.tv_sec;
        (conn->created).tv_usec = cVar38.tv_usec;
        cVar38 = Curl_now();
        (conn->keepalive).tv_sec = cVar38.tv_sec;
        (conn->keepalive).tv_usec = cVar38.tv_usec;
        conn->upkeep_interval_ms = (data->set).upkeep_interval_ms;
        conn->data = data;
        cVar2 = (data->set).proxytype;
        (conn->http_proxy).proxytype = cVar2;
        (conn->socks_proxy).proxytype = CURLPROXY_SOCKS4;
        pcVar17 = (data->set).str[0x15];
        if ((pcVar17 == (char *)0x0) || (*pcVar17 == '\0')) {
          uVar33 = *(uint *)&(conn->bits).field_0x4 & 0xffffffef;
          uVar25 = 0;
        }
        else {
          uVar33 = *(uint *)&(conn->bits).field_0x4 | 0x10;
          uVar25 = 0x20;
          if (CURLPROXY_HTTP_1_0 < cVar2) {
            uVar25 = (uint)(cVar2 == CURLPROXY_HTTPS) << 5;
          }
        }
        puVar28 = &(conn->bits).field_0x4;
        uVar33 = uVar33 & 0xffffff9f | uVar25 | (uVar25 * 2 ^ 0x40) & (int)(uVar33 << 0x1b) >> 0x1f;
        *(uint *)puVar28 = uVar33;
        pcVar17 = (data->set).str[0x16];
        if ((pcVar17 != (char *)0x0) && (*pcVar17 != '\0')) {
          uVar33 = uVar33 | 0x50;
          *(uint *)puVar28 = uVar33;
        }
        uVar25 = (uint)((data->set).str[0x2f] != (char *)0x0) << 8;
        *(uint *)&(conn->bits).field_0x4 = uVar33 & 0xfffffeff | uVar25;
        uVar26 = (*(uint *)&(data->set).field_0x878 & 0x400) << 4;
        *(uint *)&(conn->bits).field_0x4 = uVar33 & 0xffffbeff | uVar25 | uVar26;
        uVar27 = (uint)((data->set).str[0x2c] != (char *)0x0) << 7;
        *(uint *)&(conn->bits).field_0x4 = uVar33 & 0xffffbe7f | uVar25 | uVar26 | uVar27;
        uVar33 = (uVar33 & 0xfffdbe7f | uVar25 | uVar26 | uVar27) +
                 (*(uint *)&(data->set).field_0x878 & 0x8000) * 4;
        *(uint *)&(conn->bits).field_0x4 = uVar33;
        uVar33 = (uVar33 & 0xfffbffff) + (*(uint *)&(data->set).field_0x878 & 0x10000) * 4;
        *(uint *)&(conn->bits).field_0x4 = uVar33;
        bVar30 = (data->set).ssl.primary.field_0x48 & 4;
        bVar32 = (conn->ssl_config).field_0x48;
        bVar1 = (conn->proxy_ssl_config).field_0x48;
        (conn->ssl_config).field_0x48 = bVar32 & 0xfb | bVar30;
        bVar31 = (data->set).ssl.primary.field_0x48 & 1;
        (conn->ssl_config).field_0x48 = bVar32 & 0xfa | bVar30 | bVar31;
        (conn->ssl_config).field_0x48 =
             bVar32 & 0xf8 | bVar30 | bVar31 | (data->set).ssl.primary.field_0x48 & 2;
        bVar32 = (data->set).proxy_ssl.primary.field_0x48 & 4;
        (conn->proxy_ssl_config).field_0x48 = bVar1 & 0xfb | bVar32;
        bVar30 = (data->set).proxy_ssl.primary.field_0x48 & 1;
        (conn->proxy_ssl_config).field_0x48 = bVar1 & 0xfa | bVar32 | bVar30;
        (conn->proxy_ssl_config).field_0x48 =
             bVar1 & 0xf8 | bVar32 | bVar30 | (data->set).proxy_ssl.primary.field_0x48 & 2;
        conn->ip_version = (data->set).ipver;
        *(uint *)&(conn->bits).field_0x4 =
             uVar33 & 0x7fffffff | (uint)(*(ulong *)&(data->set).field_0x878 >> 6) & 0x80000000;
        Curl_llist_init(&conn->easyq,llist_dtor);
        pcVar17 = (data->set).str[8];
        if (pcVar17 != (char *)0x0) {
          pcVar17 = (*Curl_cstrdup)(pcVar17);
          conn->localdev = pcVar17;
          if (pcVar17 == (char *)0x0) {
            Curl_llist_destroy(&conn->easyq,(void *)0x0);
            (*Curl_cfree)(conn->localdev);
            (*Curl_cfree)(conn->ssl_extra);
            (*Curl_cfree)(conn);
            goto LAB_004bf955;
          }
        }
        conn->localportrange = (data->set).localportrange;
        conn->localport = (data->set).localport;
        pvVar5 = (data->set).closesocket_client;
        conn->fclosesocket = (data->set).fclosesocket;
        conn->closesocket_client = pvVar5;
        local_250 = asyncp;
        up_free(data);
        pCVar18 = (data->set).uh;
        if (pCVar18 == (CURLU *)0x0) {
          pCVar18 = curl_url();
        }
        else {
          pCVar18 = curl_url_dup(pCVar18);
        }
        (data->state).uh = pCVar18;
        if (pCVar18 != (CURLU *)0x0) {
          if (((data->set).str[7] != (char *)0x0) &&
             (_Var7 = Curl_is_absolute_url((data->change).url,(char *)0x0,0x28), !_Var7)) {
            if (((data->change).field_0x20 & 1) != 0) {
              (*Curl_cfree)((data->change).url);
            }
            pcVar17 = curl_maprintf("%s://%s",(data->set).str[7],(data->change).url);
            if (pcVar17 == (char *)0x0) goto switchD_004bf8e7_caseD_7;
            (data->change).url = pcVar17;
            puVar28 = &(data->change).field_0x20;
            *puVar28 = *puVar28 | 1;
          }
          if ((data->set).uh == (CURLU *)0x0) {
            uVar33 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x878 >> 0x20);
            CVar10 = curl_url_set(pCVar18,CURLUPART_URL,(data->change).url,
                                  (uVar33 >> 0x11 & 0x20) + (uVar33 >> 0xb & 0x10) + 0x208);
            switch(CVar10) {
            case CURLUE_OK:
              break;
            default:
              goto switchD_004bf8e7_caseD_1;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_004bf8e7_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_004bf8e7_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_004bf8e7_caseD_8;
            }
          }
          part = &(data->state).up;
          CVar10 = curl_url_get(pCVar18,CURLUPART_SCHEME,&part->scheme,0);
          switch(CVar10) {
          case CURLUE_OK:
            pcVar17 = part->scheme;
            pCVar35 = &Curl_handler_http;
            ppCVar34 = protocols;
            local_288 = (Curl_easy *)part;
            local_258 = protocol_done;
            do {
              ppCVar34 = ppCVar34 + 1;
              iVar11 = Curl_strcasecompare(pCVar35->scheme,pcVar17);
              if (iVar11 != 0) {
                if ((((uint)(data->set).allowed_protocols & pCVar35->protocol) != 0) &&
                   ((((data->state).field_0x4e4 & 2) == 0 ||
                    (((uint)(data->set).redir_protocols & pCVar35->protocol) != 0)))) {
                  conn->given = pCVar35;
                  conn->handler = pCVar35;
                  ppcVar37 = &(data->state).up.user;
                  CVar10 = curl_url_get(pCVar18,CURLUPART_USER,ppcVar37,0x40);
                  switch(CVar10) {
                  case CURLUE_OK:
                    pcVar17 = (*Curl_cstrdup)(*ppcVar37);
                    conn->user = pcVar17;
                    if (pcVar17 == (char *)0x0) goto switchD_004bf8e7_caseD_7;
                    puVar28 = &(conn->bits).field_0x4;
                    *puVar28 = *puVar28 | 0x80;
                    break;
                  default:
                    goto switchD_004bf8e7_caseD_1;
                  case CURLUE_UNSUPPORTED_SCHEME:
                    goto switchD_004bf8e7_caseD_5;
                  case CURLUE_OUT_OF_MEMORY:
                    goto switchD_004bf8e7_caseD_7;
                  case CURLUE_USER_NOT_ALLOWED:
                    goto switchD_004bf8e7_caseD_8;
                  case CURLUE_NO_USER:
                    break;
                  }
                  ppcVar37 = &(data->state).up.password;
                  CVar10 = curl_url_get(pCVar18,CURLUPART_PASSWORD,ppcVar37,0x40);
                  switch(CVar10) {
                  case CURLUE_UNSUPPORTED_SCHEME:
                    goto switchD_004bf8e7_caseD_5;
                  case CURLUE_URLDECODE:
                  case CURLUE_UNKNOWN_PART:
                  case CURLUE_NO_SCHEME:
                  case CURLUE_NO_USER:
                    goto switchD_004bf8e7_caseD_1;
                  case CURLUE_OUT_OF_MEMORY:
                    goto switchD_004bf8e7_caseD_7;
                  case CURLUE_USER_NOT_ALLOWED:
                    goto switchD_004bf8e7_caseD_8;
                  case CURLUE_NO_PASSWORD:
                    break;
                  default:
                    if (CVar10 != CURLUE_OK) goto switchD_004bf8e7_caseD_1;
                    pcVar17 = (*Curl_cstrdup)(*ppcVar37);
                    conn->passwd = pcVar17;
                    if (pcVar17 == (char *)0x0) goto switchD_004bf8e7_caseD_7;
                    puVar28 = &(conn->bits).field_0x4;
                    *puVar28 = *puVar28 | 0x80;
                  }
                  ppcVar37 = &(data->state).up.options;
                  CVar10 = curl_url_get(pCVar18,CURLUPART_OPTIONS,ppcVar37,0x40);
                  switch(CVar10) {
                  case CURLUE_UNSUPPORTED_SCHEME:
                    goto switchD_004bf8e7_caseD_5;
                  case CURLUE_URLDECODE:
                  case CURLUE_UNKNOWN_PART:
                  case CURLUE_NO_SCHEME:
                  case CURLUE_NO_USER:
                  case CURLUE_NO_PASSWORD:
                    goto switchD_004bf8e7_caseD_1;
                  case CURLUE_OUT_OF_MEMORY:
                    goto switchD_004bf8e7_caseD_7;
                  case CURLUE_USER_NOT_ALLOWED:
                    goto switchD_004bf8e7_caseD_8;
                  case CURLUE_NO_OPTIONS:
                    break;
                  default:
                    if (CVar10 != CURLUE_OK) goto switchD_004bf8e7_caseD_1;
                    pcVar17 = (*Curl_cstrdup)(*ppcVar37);
                    conn->options = pcVar17;
                    if (pcVar17 == (char *)0x0) goto switchD_004bf8e7_caseD_7;
                  }
                  CVar10 = curl_url_get(pCVar18,CURLUPART_HOST,&(data->state).up.hostname,0);
                  if ((CVar10 != CURLUE_OK) &&
                     (iVar11 = Curl_strcasecompare("file",(char *)local_288->next), iVar11 == 0))
                  goto switchD_004bf8e7_caseD_7;
                  CVar10 = curl_url_get(pCVar18,CURLUPART_PATH,&(data->state).up.path,0);
                  switch(CVar10) {
                  case CURLUE_OK:
                    goto switchD_004bfb81_caseD_0;
                  default:
                    goto switchD_004bf8e7_caseD_1;
                  case CURLUE_UNSUPPORTED_SCHEME:
                    goto switchD_004bf8e7_caseD_5;
                  case CURLUE_OUT_OF_MEMORY:
                    goto switchD_004bf8e7_caseD_7;
                  case CURLUE_USER_NOT_ALLOWED:
                    goto switchD_004bf8e7_caseD_8;
                  }
                }
                break;
              }
              pCVar35 = *ppCVar34;
            } while (pCVar35 != (Curl_handler *)0x0);
            Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar17);
          case CURLUE_UNSUPPORTED_SCHEME:
switchD_004bf8e7_caseD_5:
            CVar12 = CURLE_UNSUPPORTED_PROTOCOL;
            break;
          default:
switchD_004bf8e7_caseD_1:
            CVar12 = CURLE_URL_MALFORMAT;
            break;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_004bf8e7_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
switchD_004bf8e7_caseD_8:
            CVar12 = CURLE_LOGIN_DENIED;
          }
          goto LAB_004c0a4e;
        }
      }
      goto switchD_004bf8e7_caseD_7;
    }
    goto LAB_004c0a4b;
  }
  goto LAB_004c0a4e;
switchD_004bfb81_caseD_0:
  ppcVar37 = &(data->state).up.port;
  CVar10 = curl_url_get(pCVar18,CURLUPART_PORT,ppcVar37,1);
  if (CVar10 == CURLUE_OK) {
    uVar20 = strtoul(*ppcVar37,(char **)0x0,10);
    uVar9 = curlx_ultous(uVar20);
    conn->remote_port = (uint)uVar9;
  }
  else {
    iVar11 = Curl_strcasecompare("file",(char *)local_288->next);
    if (iVar11 == 0) goto switchD_004bf8e7_caseD_7;
  }
  curl_url_get(pCVar18,CURLUPART_QUERY,&(data->state).up.query,0);
  pcVar17 = (data->state).up.hostname;
  pcVar22 = "";
  if (pcVar17 != (char *)0x0) {
    pcVar22 = pcVar17;
  }
  if (*pcVar22 == '[') {
    CVar10 = curl_url_get(pCVar18,CURLUPART_ZONEID,local_238,0);
    puVar28 = &(conn->bits).field_0x5;
    *puVar28 = *puVar28 | 2;
    pcVar17 = pcVar22 + 1;
    sVar19 = strlen(pcVar17);
    pcVar22[sVar19] = '\0';
    pcVar22 = pcVar17;
    if (local_238[0] != (char *)0x0 && CVar10 == CURLUE_OK) {
      uVar20 = strtoul(local_238[0],local_138,10);
      if (uVar20 < 0xffffffff && *local_138[0] == '\0') {
        conn->scope_id = (uint)uVar20;
      }
      (*Curl_cfree)(local_238[0]);
    }
  }
  pcVar17 = (*Curl_cstrdup)(pcVar22);
  (conn->host).rawalloc = pcVar17;
  if (pcVar17 == (char *)0x0) goto switchD_004bf8e7_caseD_7;
  (conn->host).name = pcVar17;
  uVar33 = (data->set).scope_id;
  if (uVar33 != 0) {
    conn->scope_id = uVar33;
  }
  pcVar17 = (data->set).str[0x39];
  if (pcVar17 != (char *)0x0) {
    pcVar17 = (*Curl_cstrdup)(pcVar17);
    conn->oauth_bearer = pcVar17;
    if (pcVar17 == (char *)0x0) goto switchD_004bf8e7_caseD_7;
  }
  local_288 = conn->data;
  if (((conn->bits).field_0x5 & 1) != 0) {
    memset(local_238,0,0x100);
    memset(local_138,0,0x100);
    pcVar17 = (local_288->set).str[0x2f];
    if (pcVar17 != (char *)0x0) {
      strncpy((char *)local_238,pcVar17,0x100);
      local_139 = 0;
    }
    pcVar17 = (local_288->set).str[0x30];
    if (pcVar17 != (char *)0x0) {
      strncpy((char *)local_138,pcVar17,0x100);
      local_39 = 0;
    }
    CVar12 = Curl_urldecode(local_288,(char *)local_238,0,&(conn->http_proxy).user,(size_t *)0x0,
                            false);
    if (CVar12 != CURLE_OK) goto LAB_004bfe10;
    local_290 = (char *)0x0;
    CVar12 = Curl_urldecode(local_288,(char *)local_138,0,&(conn->http_proxy).passwd,(size_t *)0x0,
                            false);
    local_2a0 = (char *)0x0;
    if (CVar12 != CURLE_OK) goto LAB_004c0377;
  }
  pcVar17 = (local_288->set).str[0x15];
  if (pcVar17 == (char *)0x0) {
    local_2a0 = (char *)0x0;
  }
  else {
    local_2a0 = (*Curl_cstrdup)(pcVar17);
    if (local_2a0 == (char *)0x0) {
      local_290 = (char *)0x0;
      Curl_failf(local_288,"memory shortage");
      CVar12 = CURLE_OUT_OF_MEMORY;
      goto LAB_004c036e;
    }
  }
  pcVar17 = (local_288->set).str[0x16];
  if (pcVar17 == (char *)0x0) {
    local_290 = (char *)0x0;
  }
  else {
    local_290 = (*Curl_cstrdup)(pcVar17);
    if (local_290 == (char *)0x0) {
      local_290 = (char *)0x0;
      Curl_failf(local_288,"memory shortage");
      CVar12 = CURLE_OUT_OF_MEMORY;
      goto LAB_004c0377;
    }
  }
  if ((local_288->set).str[0x31] == (char *)0x0) {
    pcVar17 = "no_proxy";
    local_278 = curl_getenv("no_proxy");
    if (local_278 == (char *)0x0) {
      pcVar17 = "NO_PROXY";
      local_278 = curl_getenv("NO_PROXY");
      if (local_278 == (char *)0x0) goto LAB_004bfeca;
    }
    Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar17,local_278);
  }
  else {
LAB_004bfeca:
    local_278 = (char *)0x0;
  }
  pcVar17 = (local_288->set).str[0x31];
  if (pcVar17 == (char *)0x0) {
    pcVar17 = local_278;
  }
  if ((pcVar17 == (char *)0x0) || (*pcVar17 == '\0')) goto LAB_004c00c1;
  local_280 = (conn->host).name;
  iVar11 = Curl_strcasecompare("*",pcVar17);
  if (iVar11 != 0) goto LAB_004bff67;
  sVar19 = strlen(pcVar17);
  if (*local_280 == '[') {
    local_270 = strchr(local_280,0x5d);
    if (local_270 == (char *)0x0) goto LAB_004c00c1;
    local_280 = local_280 + 1;
    local_270 = local_270 + -(long)local_280;
  }
  else {
    local_270 = (char *)strlen(local_280);
  }
  if (sVar19 == 0) goto LAB_004c00c1;
  local_280 = local_280 + (long)local_270;
  uVar20 = 0;
  goto LAB_004bfff6;
LAB_004bff67:
  (*Curl_cfree)(local_2a0);
  (*Curl_cfree)(local_290);
  (*Curl_cfree)(local_278);
LAB_004c0328:
  uVar33 = *(uint *)&(conn->bits).field_0x4 & 0xffffff9f;
LAB_004c0332:
  uVar25 = 0x10;
  if ((uVar33 & 0x20) == 0) {
    uVar25 = uVar33 >> 2 & 0x10;
  }
  *(uint *)&(conn->bits).field_0x4 = uVar33 & 0xffffffef | uVar25;
  if (uVar25 == 0) {
    *(uint *)&(conn->bits).field_0x4 = uVar33 & 0xffffbe8f;
  }
  local_290 = (char *)0x0;
  CVar12 = CURLE_OK;
  goto LAB_004c036e;
LAB_004bfff6:
  do {
    uVar29 = uVar20 + 1;
    if (uVar20 + 1 < sVar19) {
      uVar29 = sVar19;
    }
    do {
      uVar21 = uVar20;
      if ((0x2c < (ulong)(byte)pcVar17[uVar20]) ||
         ((0x100100000001U >> ((ulong)(byte)pcVar17[uVar20] & 0x3f) & 1) == 0)) break;
      uVar20 = uVar20 + 1;
      uVar21 = uVar29;
    } while (uVar29 != uVar20);
    if (uVar21 == sVar19) break;
    uVar20 = uVar21;
    sVar36 = uVar21;
    if (uVar21 < sVar19) {
      do {
        if (((ulong)(byte)pcVar17[sVar36] < 0x2d) &&
           (uVar20 = sVar36, (0x100100000001U >> ((ulong)(byte)pcVar17[sVar36] & 0x3f) & 1) != 0))
        break;
        sVar36 = sVar36 + 1;
        uVar20 = sVar19;
      } while (sVar19 != sVar36);
    }
    lVar24 = (pcVar17[uVar21] == '.') + uVar21;
    pcVar22 = (char *)(uVar20 - lVar24);
    if (pcVar22 <= local_270) {
      local_240 = local_280 + -(long)pcVar22;
      iVar11 = Curl_strncasecompare(pcVar17 + lVar24,local_240,(size_t)pcVar22);
      if ((iVar11 != 0) && ((pcVar22 == local_270 || (local_240[-1] == '.')))) goto LAB_004bff67;
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 < sVar19);
LAB_004c00c1:
  if (local_2a0 == (char *)0x0 && local_290 == (char *)0x0) {
    pcVar22 = conn->handler->scheme;
    cVar8 = *pcVar22;
    pcVar17 = (char *)local_238;
    ppcVar37 = (char **)pcVar17;
    if (cVar8 != '\0') {
      ppcVar37 = local_238;
      do {
        pcVar22 = pcVar22 + 1;
        iVar11 = tolower((int)cVar8);
        *(char *)ppcVar37 = (char)iVar11;
        ppcVar37 = (char **)((long)ppcVar37 + 1);
        cVar8 = *pcVar22;
      } while (cVar8 != '\0');
    }
    builtin_strncpy((char *)((long)ppcVar37 + 3),"oxy",4);
    *(undefined4 *)ppcVar37 = 0x6f72705f;
    local_2a0 = curl_getenv(pcVar17);
    if (local_2a0 == (char *)0x0) {
      pcVar17 = (char *)local_238;
      iVar11 = Curl_strcasecompare("http_proxy",pcVar17);
      if (iVar11 == 0) {
        Curl_strntoupper(pcVar17,pcVar17,0x80);
        local_2a0 = curl_getenv(pcVar17);
        if (local_2a0 != (char *)0x0) goto LAB_004c01a6;
      }
      pcVar17 = "all_proxy";
      local_2a0 = curl_getenv("all_proxy");
      if (local_2a0 != (char *)0x0) goto LAB_004c01a6;
      pcVar17 = "ALL_PROXY";
      local_2a0 = curl_getenv("ALL_PROXY");
      if (local_2a0 != (char *)0x0) goto LAB_004c01a6;
      local_2a0 = (char *)0x0;
    }
    else {
LAB_004c01a6:
      Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar17,local_2a0);
    }
    local_290 = (char *)0x0;
  }
  (*Curl_cfree)(local_278);
  if (local_2a0 == (char *)0x0) {
LAB_004c0206:
    local_2a0 = (char *)0x0;
  }
  else if ((*local_2a0 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
    (*Curl_cfree)(local_2a0);
    goto LAB_004c0206;
  }
  if (local_290 == (char *)0x0) {
LAB_004c024c:
    if (local_2a0 == (char *)0x0) goto LAB_004c0328;
    local_290 = (char *)0x0;
    bVar6 = false;
LAB_004c0264:
    CVar12 = parse_proxy(local_288,conn,local_2a0,(conn->http_proxy).proxytype);
    (*Curl_cfree)(local_2a0);
    if (CVar12 == CURLE_OK) {
      if (bVar6) goto LAB_004c029d;
      goto LAB_004c02d1;
    }
  }
  else {
    if ((*local_290 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(local_290);
      goto LAB_004c024c;
    }
    bVar6 = true;
    if (local_2a0 != (char *)0x0) goto LAB_004c0264;
LAB_004c029d:
    pcVar17 = local_290;
    CVar12 = parse_proxy(local_288,conn,local_290,(conn->socks_proxy).proxytype);
    (*Curl_cfree)(pcVar17);
    if (CVar12 == CURLE_OK) {
LAB_004c02d1:
      if ((conn->http_proxy).host.rawalloc == (char *)0x0) {
        uVar33 = *(uint *)&(conn->bits).field_0x4 & 0xffffbfdf;
        *(uint *)&(conn->bits).field_0x4 = uVar33;
        if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_004c08a1;
        if ((conn->socks_proxy).user == (char *)0x0) {
          pcVar17 = (conn->socks_proxy).passwd;
          (conn->socks_proxy).user = (conn->http_proxy).user;
          (conn->http_proxy).user = (char *)0x0;
          (*Curl_cfree)(pcVar17);
          (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
          (conn->http_proxy).passwd = (char *)0x0;
          uVar33 = *(uint *)&(conn->bits).field_0x4;
        }
      }
      else {
        uVar33 = *(uint *)&(conn->bits).field_0x4;
        if ((conn->handler->protocol & 3) == 0) {
          if (((conn->handler->flags & 0x800) == 0) || ((uVar33 & 0x4000) != 0)) {
            uVar33 = uVar33 | 0x4000;
          }
          else {
            conn->handler = &Curl_handler_http;
          }
        }
        uVar33 = uVar33 | 0x20;
        if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_004c08a1:
          uVar33 = uVar33 & 0xffffffbf;
          goto LAB_004c0332;
        }
      }
      uVar33 = uVar33 | 0x40;
      goto LAB_004c0332;
    }
LAB_004bfe10:
    local_290 = (char *)0x0;
  }
LAB_004c036e:
  local_2a0 = (char *)0x0;
LAB_004c0377:
  (*Curl_cfree)(local_290);
  (*Curl_cfree)(local_2a0);
  if (CVar12 == CURLE_OK) {
    if (((conn->given->flags & 1) != 0) &&
       (uVar33 = *(uint *)&(conn->bits).field_0x4, (uVar33 & 0x20) != 0)) {
      *(uint *)&(conn->bits).field_0x4 = uVar33 | 0x4000;
    }
    lVar24 = (data->set).use_port;
    if ((lVar24 == 0) || (((data->state).field_0x4e4 & 0x10) == 0)) {
LAB_004c041c:
      CVar12 = override_login(data,conn,&conn->user,&conn->passwd,&conn->options);
      if (((CVar12 == CURLE_OK) && (CVar12 = set_login(conn), CVar12 == CURLE_OK)) &&
         (CVar12 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar12 == CURLE_OK)) {
        pCVar3 = conn->data;
        pcVar17 = (conn->host).name;
        (conn->host).dispname = pcVar17;
        do {
          cVar8 = *pcVar17;
          pcVar17 = pcVar17 + 1;
        } while ('\0' < cVar8);
        if (cVar8 != '\0') {
          Curl_infof(pCVar3,"IDN support not present, can\'t parse Unicode domains\n");
        }
        uVar33 = *(uint *)&(conn->bits).field_0x4;
        if ((uVar33 & 4) != 0) {
          pCVar3 = conn->data;
          pcVar17 = (conn->conn_to_host).name;
          (conn->conn_to_host).dispname = pcVar17;
          do {
            cVar8 = *pcVar17;
            pcVar17 = pcVar17 + 1;
          } while ('\0' < cVar8);
          if (cVar8 != '\0') {
            Curl_infof(pCVar3,"IDN support not present, can\'t parse Unicode domains\n");
            uVar33 = *(uint *)&(conn->bits).field_0x4;
          }
        }
        if ((uVar33 & 0x20) != 0) {
          pCVar3 = conn->data;
          pcVar17 = (conn->http_proxy).host.name;
          (conn->http_proxy).host.dispname = pcVar17;
          do {
            cVar8 = *pcVar17;
            pcVar17 = pcVar17 + 1;
          } while ('\0' < cVar8);
          if (cVar8 != '\0') {
            Curl_infof(pCVar3,"IDN support not present, can\'t parse Unicode domains\n");
            uVar33 = *(uint *)&(conn->bits).field_0x4;
          }
        }
        if ((uVar33 & 0x40) != 0) {
          pCVar3 = conn->data;
          pcVar17 = (conn->socks_proxy).host.name;
          (conn->socks_proxy).host.dispname = pcVar17;
          do {
            cVar8 = *pcVar17;
            pcVar17 = pcVar17 + 1;
          } while ('\0' < cVar8);
          if (cVar8 != '\0') {
            Curl_infof(pCVar3,"IDN support not present, can\'t parse Unicode domains\n");
            uVar33 = *(uint *)&(conn->bits).field_0x4;
          }
        }
        if ((uVar33 & 4) != 0) {
          iVar11 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name);
          uVar33 = *(uint *)&(conn->bits).field_0x4;
          if (iVar11 != 0) {
            uVar33 = uVar33 & 0xfffffffb;
            *(uint *)&(conn->bits).field_0x4 = uVar33;
          }
        }
        if (((uVar33 & 8) != 0) && (conn->conn_to_port == conn->remote_port)) {
          uVar33 = uVar33 & 0xfffffff7;
          *(uint *)&(conn->bits).field_0x4 = uVar33;
        }
        if ((uVar33 & 0x20) != 0 && (uVar33 & 0xc) != 0) {
          *(uint *)&(conn->bits).field_0x4 = uVar33 | 0x4000;
        }
        conn->socktype = 1;
        pCVar35 = conn->handler;
        if (pCVar35->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
          CVar12 = (*pCVar35->setup_connection)(conn);
          if (CVar12 != CURLE_OK) goto LAB_004c0a4e;
          pCVar35 = conn->handler;
        }
        if (conn->port < 0) {
          conn->port = pCVar35->defport;
        }
        conn->recv[0] = Curl_recv_plain;
        conn->send[0] = Curl_send_plain;
        conn->recv[1] = Curl_recv_plain;
        conn->send[1] = Curl_send_plain;
        *(uint *)&(conn->bits).field_0x4 =
             *(uint *)&(conn->bits).field_0x4 & 0xf7ffffff |
             (uint)(*(ulong *)&(data->set).field_0x878 >> 0x11) & 0x8000000;
        if ((pCVar35->flags & 0x10) == 0) {
          pcVar17 = (data->set).str[0x1b];
          (data->set).ssl.primary.CApath = (data->set).str[0x1a];
          (data->set).proxy_ssl.primary.CApath = pcVar17;
          (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
          (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
          pcVar17 = (data->set).str[0x25];
          (data->set).ssl.primary.random_file = pcVar17;
          (data->set).proxy_ssl.primary.random_file = pcVar17;
          pcVar17 = (data->set).str[0x24];
          (data->set).ssl.primary.egdsocket = pcVar17;
          (data->set).proxy_ssl.primary.egdsocket = pcVar17;
          (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
          (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
          (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
          (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
          (data->set).ssl.CRLfile = (data->set).str[0x27];
          (data->set).proxy_ssl.CRLfile = (data->set).str[0x28];
          (data->set).ssl.issuercert = (data->set).str[0x29];
          (data->set).proxy_ssl.issuercert = (data->set).str[0x2a];
          pcVar17 = (data->set).str[0];
          pcVar22 = (data->set).str[1];
          (data->set).ssl.cert = pcVar17;
          (data->set).proxy_ssl.cert = pcVar22;
          (data->set).ssl.cert_type = (data->set).str[2];
          (data->set).proxy_ssl.cert_type = (data->set).str[3];
          pcVar4 = (data->set).str[0xe];
          (data->set).ssl.key = (data->set).str[0xd];
          (data->set).proxy_ssl.key = pcVar4;
          (data->set).ssl.key_type = (data->set).str[0x11];
          (data->set).proxy_ssl.key_type = (data->set).str[0x12];
          (data->set).ssl.key_passwd = (data->set).str[0xf];
          (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
          (data->set).ssl.primary.clientcert = pcVar17;
          (data->set).proxy_ssl.primary.clientcert = pcVar22;
          _Var7 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,&conn->ssl_config);
          if ((!_Var7) ||
             (_Var7 = Curl_clone_primary_ssl_config
                                (&(data->set).proxy_ssl.primary,&conn->proxy_ssl_config), !_Var7))
          goto switchD_004bf8e7_caseD_7;
          prune_dead_connections(data);
          uVar20 = *(ulong *)&(data->set).field_0x878;
          if ((uVar20 >> 0x21 & 1) == 0) {
            if ((uVar20 >> 0x25 & 1) != 0) goto LAB_004c09ea;
LAB_004c0941:
            _Var7 = ConnectionExists(data,conn,&local_248,&local_291,&local_292);
            pcVar23 = local_248;
            if (!_Var7) goto LAB_004c09ea;
            if (((local_291 == false) &&
                (iVar11 = IsMultiplexingPossible(data,local_248), iVar11 != 0)) &&
               ((pcVar23->easyq).size != 0)) {
              Curl_infof(data,"Found connection %ld, with %zu requests on it\n",
                         pcVar23->connection_id);
              sVar14 = Curl_conncache_bundle_size(pcVar23);
              if ((sVar14 < local_268) && (sVar14 = Curl_conncache_size(data), sVar14 < local_260))
              {
                Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
                Curl_conncache_return_conn(pcVar23);
                goto LAB_004c09ea;
              }
            }
            reuse_conn(conn,pcVar23);
            (*Curl_cfree)(conn->ssl_extra);
            (*Curl_cfree)(conn);
            pcVar17 = "proxy";
            if (((pcVar23->bits).field_0x4 & 0x10) == 0) {
              pcVar17 = "host";
            }
            lVar24 = 0x128;
            if (((pcVar23->socks_proxy).host.name == (char *)0x0) &&
               (lVar24 = 0x168, (pcVar23->http_proxy).host.name == (char *)0x0)) {
              lVar24 = 0xd8;
            }
            Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",
                       pcVar23->connection_id,pcVar17,
                       *(undefined8 *)((pcVar23->chunk).hexbuffer + lVar24 + -0x20));
            conn = pcVar23;
LAB_004c0c4f:
            Curl_init_do(data,conn);
            CVar12 = setup_range(data);
            if (CVar12 == CURLE_OK) {
              conn->seek_func = (data->set).seek_func;
              conn->seek_client = (data->set).seek_client;
              CVar12 = resolve_server(data,conn,local_250);
              strip_trailing_dot(&conn->host);
              uVar33 = *(uint *)&(conn->bits).field_0x4;
              if ((uVar33 & 0x20) != 0) {
                strip_trailing_dot(&(conn->http_proxy).host);
                uVar33 = *(uint *)&(conn->bits).field_0x4;
              }
              if ((uVar33 & 0x40) != 0) {
                strip_trailing_dot(&(conn->socks_proxy).host);
                uVar33 = *(uint *)&(conn->bits).field_0x4;
              }
              if ((uVar33 & 4) != 0) {
                strip_trailing_dot(&conn->conn_to_host);
              }
              goto LAB_004c0cf0;
            }
          }
          else {
            if (((uVar20 >> 0x25 & 1) == 0) && ((*(ushort *)&(data->state).field_0x4e4 & 2) != 0))
            goto LAB_004c0941;
LAB_004c09ea:
            if ((conn->handler->flags & 0x100) != 0) {
              uVar20 = *(ulong *)&(data->set).field_0x878;
              if ((uVar20 >> 0x2e & 1) != 0) {
                puVar28 = &(conn->bits).field_0x7;
                *puVar28 = *puVar28 | 0x20;
                uVar20 = *(ulong *)&(data->set).field_0x878;
              }
              if ((uVar20 >> 0x2d & 1) != 0) {
                puVar28 = &(conn->bits).field_0x7;
                *puVar28 = *puVar28 | 0x10;
              }
            }
            if (local_292 == false) {
              bundle = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
              if ((bundle == (connectbundle *)0x0 || local_268 == 0) ||
                 (bundle->num_connections < local_268)) {
                Curl_conncache_unlock(data);
              }
              else {
                pcVar23 = Curl_conncache_extract_bundle(data,bundle);
                Curl_conncache_unlock(data);
                if (pcVar23 == (connectdata *)0x0) {
                  Curl_infof(data,"No more connections allowed to host: %zu\n",local_268);
                  goto LAB_004c0a2d;
                }
                Curl_disconnect(data,pcVar23,false);
              }
              if ((local_260 != 0) && (sVar14 = Curl_conncache_size(data), local_260 <= sVar14)) {
                pcVar23 = Curl_conncache_extract_oldest(data);
                if (pcVar23 == (connectdata *)0x0) {
                  Curl_infof(data,"No connections available in cache\n");
                  goto LAB_004c0a2d;
                }
                Curl_disconnect(data,pcVar23,false);
              }
              CVar12 = Curl_conncache_add_conn((data->state).conn_cache,conn);
              if (CVar12 == CURLE_OK) {
                if ((((data->state).authhost.picked & 0x28) != 0) &&
                   (((data->state).authhost.field_0x18 & 1) != 0)) {
                  Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
                  (data->state).authhost.picked = 0;
                  puVar28 = &(data->state).authhost.field_0x18;
                  *puVar28 = *puVar28 & 0xfe;
                }
                if ((((data->state).authproxy.picked & 0x28) != 0) &&
                   (((data->state).authproxy.field_0x18 & 1) != 0)) {
                  Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
                  (data->state).authproxy.picked = 0;
                  puVar28 = &(data->state).authproxy.field_0x18;
                  *puVar28 = *puVar28 & 0xfe;
                }
                goto LAB_004c0c4f;
              }
            }
            else {
LAB_004c0a2d:
              Curl_infof(data,"No connections available.\n");
              conn_free(conn);
              CVar12 = CURLE_NO_CONNECTION_AVAILABLE;
LAB_004c0a4b:
              conn = (connectdata *)0x0;
            }
          }
        }
        else {
          Curl_persistconninfo(conn);
          CVar13 = (*conn->handler->connect_it)(conn,(_Bool *)local_238);
          if (CVar13 == CURLE_OK) {
            (conn->bits).tcpconnect[0] = true;
            CVar12 = Curl_conncache_add_conn((data->state).conn_cache,conn);
            if (CVar12 == CURLE_OK) {
              CVar12 = setup_range(data);
              if (CVar12 == CURLE_OK) {
                Curl_attach_connnection(data,conn);
                Curl_setup_transfer(data,-1,-1,false,-1);
                goto LAB_004c08ca;
              }
              (*conn->handler->done)(conn,CVar12,false);
            }
          }
          else {
LAB_004c08ca:
            Curl_init_do(data,conn);
            CVar12 = CVar13;
          }
LAB_004c0cf0:
          if (CVar12 == CURLE_OK) {
            if ((conn->easyq).size != 0) {
              *local_258 = true;
              goto LAB_004c0a7e;
            }
            if (*local_250 != false) goto LAB_004c0a7e;
            CVar12 = Curl_setup_conn(conn,local_258);
          }
        }
      }
    }
    else {
      conn->remote_port = (uint)lVar24 & 0xffff;
      curl_msnprintf((char *)local_238,0x10,"%d");
      CVar10 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_238,0);
      if (CVar10 == CURLUE_OK) goto LAB_004c041c;
switchD_004bf8e7_caseD_7:
      CVar12 = CURLE_OUT_OF_MEMORY;
    }
  }
LAB_004c0a4e:
  if (CVar12 == CURLE_NO_CONNECTION_AVAILABLE) {
    return CURLE_NO_CONNECTION_AVAILABLE;
  }
  if ((conn != (connectdata *)0x0) && (CVar12 != CURLE_OK)) {
    Curl_disconnect(data,conn,true);
    return CVar12;
  }
  if (CVar12 != CURLE_OK) {
    return CVar12;
  }
LAB_004c0a7e:
  if (data->conn == (connectdata *)0x0) {
    Curl_attach_connnection(data,conn);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn))
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(conn, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_disconnect(data, conn, TRUE);
  }
  else if(!result && !data->conn)
    /* FILE: transfers already have the connection attached */
    Curl_attach_connnection(data, conn);

  return result;
}